

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall
SM_Manager::FindAttr
          (SM_Manager *this,char *relName,char *attrName,RM_Record *attrRec,AttrCatEntry **entry)

{
  bool bVar1;
  RC RVar2;
  int iVar3;
  undefined1 local_d8 [7];
  bool notFound;
  SM_AttrIterator attrIt;
  RelCatEntry *local_60;
  RelCatEntry *rEntry;
  RM_Record relRec;
  RC rc;
  AttrCatEntry **entry_local;
  RM_Record *attrRec_local;
  char *attrName_local;
  char *relName_local;
  SM_Manager *this_local;
  
  relRec._20_4_ = 0;
  RM_Record::RM_Record((RM_Record *)&rEntry);
  relRec._20_4_ = GetRelEntry(this,relName,(RM_Record *)&rEntry,&local_60);
  if (relRec._20_4_ == 0) {
    SM_AttrIterator::SM_AttrIterator((SM_AttrIterator *)local_d8);
    relRec._20_4_ =
         SM_AttrIterator::OpenIterator((SM_AttrIterator *)local_d8,&this->attrcatFH,relName);
    this_local._4_4_ = relRec._20_4_;
    if (relRec._20_4_ == 0) {
      bVar1 = true;
      relRec._20_4_ = 0;
      do {
        RVar2 = SM_AttrIterator::GetNextAttr((SM_AttrIterator *)local_d8,attrRec,entry);
        if (RVar2 == 0x6e) goto LAB_0010cac9;
        iVar3 = strncmp((*entry)->attrName,attrName,0x19);
      } while (iVar3 != 0);
      bVar1 = false;
LAB_0010cac9:
      relRec._20_4_ = SM_AttrIterator::CloseIterator((SM_AttrIterator *)local_d8);
      this_local._4_4_ = relRec._20_4_;
      if ((relRec._20_4_ == 0) && (bVar1)) {
        this_local._4_4_ = 0x131;
      }
    }
    attrIt.fs.useNextPage = true;
    attrIt.fs.hasPagePinned = false;
    attrIt.fs.initializedValue = false;
    attrIt.fs._91_1_ = 0;
    SM_AttrIterator::~SM_AttrIterator((SM_AttrIterator *)local_d8);
  }
  else {
    attrIt.fs.useNextPage = true;
    attrIt.fs.hasPagePinned = false;
    attrIt.fs.initializedValue = false;
    attrIt.fs._91_1_ = 0;
    this_local._4_4_ = relRec._20_4_;
  }
  RM_Record::~RM_Record((RM_Record *)&rEntry);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::FindAttr(const char *relName, const char *attrName, RM_Record &attrRec, AttrCatEntry *&entry){
  RC rc = 0;
  RM_Record relRec;
  RelCatEntry * rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // get the relation
    return (rc);
  
  // Iterate through attrcat for attributes in this relation
  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, const_cast<char*>(relName))))
    return (rc);
  bool notFound = true;
  while(notFound){
    if((RM_EOF == attrIt.GetNextAttr(attrRec, entry))){
      break;
    }
    // Check if the attribute names match
    if(strncmp(entry->attrName, attrName, MAXNAME + 1) == 0){
      notFound = false;
      break;
    }
  }
  if((rc = attrIt.CloseIterator())) // Done with search!
    return (rc);

  if(notFound == true)  // If attribute is not found, return error
    return (SM_INVALIDATTR);
  return (rc);

}